

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

int tkinter3Present(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char lPythonParams [256];
  char lPythonCommand [256];
  undefined1 auStack_208 [256];
  char local_108 [256];
  
  memcpy(auStack_208,"-S -c \"try:\n\timport tkinter;\nexcept:\n\tprint(0);\"",0x100);
  if (tkinter3Present::lTkinter3Present < 0) {
    tkinter3Present::lTkinter3Present = 0;
    iVar1 = python3Present();
    if (iVar1 != 0) {
      sprintf(local_108,"%s %s",gPython3Name,auStack_208);
      tkinter3Present::lTkinter3Present = tryCommand(local_108);
    }
    if (tinyfd_verbose != 0) {
      printf("lTkinter3Present %d\n",(ulong)(uint)tkinter3Present::lTkinter3Present);
    }
  }
  uVar3 = 0;
  if (tkinter3Present::lTkinter3Present != 0) {
    iVar1 = graphicMode();
    if (iVar1 != 0) {
      iVar1 = isDarwin();
      if (iVar1 == 0) {
        uVar3 = 1;
      }
      else {
        pcVar2 = getenv("SSH_TTY");
        uVar3 = (uint)(pcVar2 == (char *)0x0);
      }
    }
  }
  return uVar3;
}

Assistant:

static int tkinter3Present( )
{
        static int lTkinter3Present = -1 ;
        char lPythonCommand[256];
        char lPythonParams[256] =
                "-S -c \"try:\n\timport tkinter;\nexcept:\n\tprint(0);\"";

        if ( lTkinter3Present < 0 )
        {
                lTkinter3Present = 0 ;
                if ( python3Present() )
                {
                        sprintf( lPythonCommand , "%s %s" , gPython3Name , lPythonParams ) ;
                        lTkinter3Present = tryCommand(lPythonCommand) ;
                }
                if (tinyfd_verbose) printf("lTkinter3Present %d\n", lTkinter3Present) ;
        }
        return lTkinter3Present && graphicMode() && !(isDarwin() && getenv("SSH_TTY") );
}